

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O2

void test_ecc_weierstrass_double(void)

{
  WeierstrassCurve *wc;
  WeierstrassPoint *wp;
  size_t sVar1;
  WeierstrassPoint *pWVar2;
  size_t i;
  ulong index;
  
  wc = wcurve();
  wp = ecc_weierstrass_point_new_identity(wc);
  index = 0;
  while( true ) {
    sVar1 = (*looplimit)(5);
    if (sVar1 <= index) break;
    pWVar2 = wpoint(wc,index);
    ecc_weierstrass_point_copy_into(wp,pWVar2);
    ecc_weierstrass_point_free(pWVar2);
    log_start();
    pWVar2 = ecc_weierstrass_double(wp);
    log_end();
    ecc_weierstrass_point_free(pWVar2);
    index = index + 1;
  }
  ecc_weierstrass_point_free(wp);
  ecc_weierstrass_curve_free(wc);
  return;
}

Assistant:

static void test_ecc_weierstrass_double(void)
{
    WeierstrassCurve *wc = wcurve();
    WeierstrassPoint *a = ecc_weierstrass_point_new_identity(wc);
    for (size_t i = 0; i < looplimit(5); i++) {
        WeierstrassPoint *A = wpoint(wc, i);
        ecc_weierstrass_point_copy_into(a, A);
        ecc_weierstrass_point_free(A);

        log_start();
        WeierstrassPoint *r = ecc_weierstrass_double(a);
        log_end();
        ecc_weierstrass_point_free(r);
    }
    ecc_weierstrass_point_free(a);
    ecc_weierstrass_curve_free(wc);
}